

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::LogButtons(void)

{
  int *v;
  int iVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  ImGuiContext *g;
  ImGuiWindow *window;
  int iVar8;
  float *pfVar9;
  int iVar10;
  ImVec2 local_38;
  
  pIVar3 = GImGui;
  PushID("LogButtons");
  local_38.x = 0.0;
  local_38.y = 0.0;
  bVar5 = Button("Log To TTY",&local_38);
  pIVar4 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  if (pIVar2->SkipItems == false) {
    (pIVar2->DC).CursorPos.x = (pIVar4->Style).ItemSpacing.x + (pIVar2->DC).CursorPosPrevLine.x;
    (pIVar2->DC).CursorPos.y = (pIVar2->DC).CursorPosPrevLine.y;
    (pIVar2->DC).CurrentLineSize = (pIVar2->DC).PrevLineSize;
    (pIVar2->DC).CurrentLineTextBaseOffset = (pIVar2->DC).PrevLineTextBaseOffset;
  }
  local_38.x = 0.0;
  local_38.y = 0.0;
  bVar6 = Button("Log To File",&local_38);
  pIVar4 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  if (pIVar2->SkipItems == false) {
    (pIVar2->DC).CursorPos.x = (pIVar4->Style).ItemSpacing.x + (pIVar2->DC).CursorPosPrevLine.x;
    (pIVar2->DC).CursorPos.y = (pIVar2->DC).CursorPosPrevLine.y;
    (pIVar2->DC).CurrentLineSize = (pIVar2->DC).PrevLineSize;
    (pIVar2->DC).CurrentLineTextBaseOffset = (pIVar2->DC).PrevLineTextBaseOffset;
  }
  local_38.x = 0.0;
  local_38.y = 0.0;
  bVar7 = Button("Log To Clipboard",&local_38);
  pIVar4 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  if (pIVar2->SkipItems == false) {
    (pIVar2->DC).CursorPos.x = (pIVar4->Style).ItemSpacing.x + (pIVar2->DC).CursorPosPrevLine.x;
    (pIVar2->DC).CursorPos.y = (pIVar2->DC).CursorPosPrevLine.y;
    (pIVar2->DC).CurrentLineSize = (pIVar2->DC).PrevLineSize;
    (pIVar2->DC).CurrentLineTextBaseOffset = (pIVar2->DC).PrevLineTextBaseOffset;
  }
  PushItemWidth(80.0);
  PushItemFlag(1,true);
  v = &pIVar3->LogAutoExpandMaxDepth;
  iVar8 = 0;
  SliderInt("Depth",v,0,9,(char *)0x0);
  pIVar4 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  iVar1 = (pIVar2->DC).ItemFlagsStack.Size;
  iVar10 = iVar1 + -1;
  (pIVar2->DC).ItemFlagsStack.Size = iVar10;
  if (iVar10 != 0) {
    iVar8 = (pIVar2->DC).ItemFlagsStack.Data[(long)iVar1 + -2];
  }
  (pIVar2->DC).ItemFlags = iVar8;
  pIVar2->WriteAccessed = true;
  iVar1 = (pIVar2->DC).ItemWidthStack.Size;
  iVar8 = iVar1 + -1;
  (pIVar2->DC).ItemWidthStack.Size = iVar8;
  if (iVar8 == 0) {
    pfVar9 = &pIVar2->ItemWidthDefault;
  }
  else {
    pfVar9 = (pIVar2->DC).ItemWidthStack.Data + (long)iVar1 + -2;
  }
  (pIVar2->DC).ItemWidth = *pfVar9;
  (pIVar2->IDStack).Size = (pIVar2->IDStack).Size + -1;
  if ((bVar5) && (pIVar4->LogEnabled == false)) {
    iVar1 = *v;
    pIVar4->LogFile = _stdout;
    pIVar4->LogEnabled = true;
    pIVar4->LogStartDepth = (pIVar2->DC).TreeDepth;
    if (-1 < iVar1) {
      pIVar4->LogAutoExpandMaxDepth = iVar1;
    }
  }
  if (bVar6) {
    LogToFile(pIVar3->LogAutoExpandMaxDepth,(pIVar3->IO).LogFilename);
  }
  pIVar3 = GImGui;
  if ((bVar7) && (GImGui->LogEnabled == false)) {
    iVar1 = *v;
    pIVar2 = GImGui->CurrentWindow;
    GImGui->LogFile = (FILE *)0x0;
    pIVar3->LogEnabled = true;
    pIVar3->LogStartDepth = (pIVar2->DC).TreeDepth;
    if (-1 < iVar1) {
      pIVar3->LogAutoExpandMaxDepth = iVar1;
    }
  }
  return;
}

Assistant:

void ImGui::LogButtons()
{
    ImGuiContext& g = *GImGui;

    PushID("LogButtons");
    const bool log_to_tty = Button("Log To TTY"); SameLine();
    const bool log_to_file = Button("Log To File"); SameLine();
    const bool log_to_clipboard = Button("Log To Clipboard"); SameLine();
    PushItemWidth(80.0f);
    PushAllowKeyboardFocus(false);
    SliderInt("Depth", &g.LogAutoExpandMaxDepth, 0, 9, NULL);
    PopAllowKeyboardFocus();
    PopItemWidth();
    PopID();

    // Start logging at the end of the function so that the buttons don't appear in the log
    if (log_to_tty)
        LogToTTY(g.LogAutoExpandMaxDepth);
    if (log_to_file)
        LogToFile(g.LogAutoExpandMaxDepth, g.IO.LogFilename);
    if (log_to_clipboard)
        LogToClipboard(g.LogAutoExpandMaxDepth);
}